

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicBWT.h
# Opt level: O0

ulint __thiscall
bwtil::
DynamicBWT<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
::extend(DynamicBWT<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
         *this,symbol s)

{
  reference pvVar1;
  ulint uVar2;
  byte in_SIL;
  long in_RDI;
  ulint unaff_retaddr;
  undefined7 in_stack_00000008;
  symbol in_stack_0000000f;
  undefined7 in_stack_00000010;
  bool in_stack_00000017;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_stack_00000018;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_00000020;
  bool sampled;
  ulint i;
  size_t in_stack_00000048;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_00000050;
  undefined7 in_stack_ffffffffffffffc8;
  bool bVar3;
  undefined1 uVar4;
  dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this_00;
  ulong local_18;
  
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
            ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
             CONCAT17(in_stack_00000017,in_stack_00000010),in_stack_0000000f,unaff_retaddr);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8),
                      (ulong)in_SIL);
  this_00 = (dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)*pvVar1;
  uVar2 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
                    (in_stack_00000018,in_stack_00000017,
                     CONCAT17(in_stack_0000000f,in_stack_00000008));
  *(ulint *)(in_RDI + 0x90) = (long)&this_00->width + uVar2;
  for (local_18 = (ulong)(int)(in_SIL + 1); local_18 < *(ulong *)(in_RDI + 0xa0);
      local_18 = local_18 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8),
                        local_18);
    *pvVar1 = *pvVar1 + 1;
  }
  if (*(long *)(in_RDI + 0xc0) != 0) {
    bVar3 = true;
    if (*(ulong *)(in_RDI + 0x98) % *(ulong *)(in_RDI + 0xc0) != 0) {
      bVar3 = *(long *)(in_RDI + 0x98) == *(long *)(in_RDI + 0x88) + -1;
    }
    uVar4 = bVar3;
    bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::insert
              (in_stack_00000020,(size_t)in_stack_00000018,in_stack_00000017);
    if (bVar3 != false) {
      uVar2 = in_RDI + 0xd8;
      bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
                (in_stack_00000050,in_stack_00000048,this._7_1_);
      dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
                (this_00,CONCAT17(uVar4,in_stack_ffffffffffffffc8),uVar2);
    }
  }
  *(long *)(in_RDI + 0x98) = *(long *)(in_RDI + 0x98) + 1;
  return *(ulint *)(in_RDI + 0x90);
}

Assistant:

ulint extend(symbol s){

		//insert in position terminator_pos character s
		ds.insert(s,terminator_pos);

		//update terminator position
		terminator_pos = F[s] + ds.rank(s,terminator_pos);

		//update F
		for(ulint i=s+1;i<sigma;i++)
			F[i]++;

		//update samples
		if(sample_rate>0){

			//check if this position has to be sampled
			//first text position is always sampled
			bool sampled = ((current_size%sample_rate)==0) or current_size==n-1;

			//always update bitvector
			sampled_positions.insert(terminator_pos,sampled);

			//update dynamic vector only if the position is sampled
			if(sampled)
				sa_samples.insert( sampled_positions.rank(terminator_pos,true), current_size );

		}

		current_size++;

		return terminator_pos;

	}